

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O3

int find_sender(node_info *info,int num_proc,int recv_node,int tile,int display_node,int num_tiles,
               IceTBoolean *all_contained_tmasks)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  
  iVar2 = 0;
  if (0 < num_proc) {
    piVar5 = &info[(ulong)(uint)num_proc - 1].tile_receiving;
    uVar3 = 0xffffffff;
    uVar4 = (ulong)(uint)num_proc;
    do {
      if (((piVar5[-1] < 0) &&
          (all_contained_tmasks[((node_info *)(piVar5 + -4))->rank * num_tiles + tile] != '\0')) &&
         ((ulong)(uint)recv_node + 1 != uVar4 &&
          (((node_info *)(piVar5 + -4))->rank != display_node && *piVar5 != tile))) {
        if (piVar5[-2] == tile) {
          uVar3 = (int)uVar4 - 1;
          goto LAB_00117a74;
        }
        if ((int)uVar3 < 0) {
          uVar3 = (int)uVar4 - 1;
        }
      }
      piVar5 = piVar5 + -7;
      bVar1 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar1);
    iVar2 = 0;
    if (-1 < (int)uVar3) {
LAB_00117a74:
      info[recv_node].tile_held = tile;
      info[recv_node].tile_receiving = tile;
      iVar2 = info[uVar3].rank;
      info[recv_node].recv_src = iVar2;
      info[uVar3].tile_sending = tile;
      info[uVar3].send_dest = info[recv_node].rank;
      if (info[uVar3].tile_held == tile) {
        info[uVar3].tile_held = -1;
      }
      info[uVar3].num_contained = info[uVar3].num_contained + -1;
      all_contained_tmasks[iVar2 * num_tiles + tile] = '\0';
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int find_sender(struct node_info *info, int num_proc,
                       int recv_node, int tile,
                       int display_node, int num_tiles,
                       IceTBoolean *all_contained_tmasks)
{
    int send_node;
    int sender = -1;

    for (send_node = num_proc-1; send_node >= 0; send_node--) {
        if (   (info[send_node].tile_sending >= 0)
            || !CONTAINS_TILE(send_node, tile)
            || (info[send_node].tile_receiving == tile)
            || (info[send_node].rank == display_node)
            || (send_node == recv_node) ) {
            continue;
        }
        if (info[send_node].tile_held == tile) {
          /* Favor sending held images. */
            sender = send_node;
            break;
        } else if (sender < 0) {
            sender = send_node;
        }
    }
    
    if (sender >= 0) {
        info[recv_node].tile_held = tile;
        info[recv_node].tile_receiving = tile;
        info[recv_node].recv_src = info[sender].rank;
        info[sender].tile_sending = tile;
        info[sender].send_dest = info[recv_node].rank;
        if (info[sender].tile_held == tile) info[sender].tile_held = -1;
        info[sender].num_contained--;
        all_contained_tmasks[info[sender].rank*num_tiles + tile] = 0;
        return 1;
    } else {
        return 0;
    }
}